

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O1

int luaU_dump(lua_State *L,Proto *f,lua_Writer w,void *data,int strip)

{
  StkId pSVar1;
  Table *x_;
  lu_byte x_2;
  lu_byte x;
  undefined1 local_69;
  long local_68;
  DumpState local_60;
  
  local_60.h = luaH_new(L);
  pSVar1 = (L->top).p;
  (pSVar1->val).value_.gc = (GCObject *)local_60.h;
  (pSVar1->val).tt_ = 'E';
  (L->top).p = (StkId)((L->top).offset + 0x10);
  local_60.offset = 0;
  local_60.status = 0;
  local_60.nstr = 0;
  local_60.L = L;
  local_60.writer = w;
  local_60.data = data;
  local_60.strip = strip;
  local_60.status = (*w)(L,"\x1bLua",4,data);
  local_60.offset = local_60.offset + 4;
  local_68._0_1_ = 0x55;
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,&local_68,1,local_60.data);
    local_60.offset = local_60.offset + 1;
  }
  local_68 = (ulong)local_68._1_7_ << 8;
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,&local_68,1,local_60.data);
    local_60.offset = local_60.offset + 1;
  }
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,anon_var_dwarf_ecb7,6,local_60.data);
    local_60.offset = local_60.offset + 6;
  }
  local_68 = CONCAT44(local_68._4_4_,0xffffa988);
  local_69 = 4;
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,&local_69,1,local_60.data);
    local_60.offset = local_60.offset + 1;
  }
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,&local_68,4,local_60.data);
    local_60.offset = local_60.offset + 4;
  }
  local_68 = CONCAT44(local_68._4_4_,0x12345678);
  local_69 = 4;
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,&local_69,1,local_60.data);
    local_60.offset = local_60.offset + 1;
  }
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,&local_68,4,local_60.data);
    local_60.offset = local_60.offset + 4;
  }
  local_68 = -0x5678;
  local_69 = 8;
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,&local_69,1,local_60.data);
    local_60.offset = local_60.offset + 1;
  }
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,&local_68,8,local_60.data);
    local_60.offset = local_60.offset + 8;
  }
  local_68 = -0x3f88d80000000000;
  local_69 = 8;
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,&local_69,1,local_60.data);
    local_60.offset = local_60.offset + 1;
  }
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,&local_68,8,local_60.data);
    local_60.offset = local_60.offset + 8;
  }
  local_68 = CONCAT71(local_68._1_7_,(char)f->sizeupvalues);
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,&local_68,1,local_60.data);
    local_60.offset = local_60.offset + 1;
  }
  dumpFunction(&local_60,f);
  if (local_60.status == 0) {
    local_60.status = (*local_60.writer)(local_60.L,(void *)0x0,0,local_60.data);
  }
  return local_60.status;
}

Assistant:

int luaU_dump (lua_State *L, const Proto *f, lua_Writer w, void *data,
               int strip) {
  DumpState D;
  D.h = luaH_new(L);  /* aux. table to keep strings already dumped */
  sethvalue2s(L, L->top.p, D.h);  /* anchor it */
  L->top.p++;
  D.L = L;
  D.writer = w;
  D.offset = 0;
  D.data = data;
  D.strip = strip;
  D.status = 0;
  D.nstr = 0;
  dumpHeader(&D);
  dumpByte(&D, f->sizeupvalues);
  dumpFunction(&D, f);
  dumpBlock(&D, NULL, 0);  /* signal end of dump */
  return D.status;
}